

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O3

uint duckdb_lz4::LZ4_count(BYTE *pIn,BYTE *pMatch,BYTE *pInLimit)

{
  ulong *puVar1;
  ulong *puVar2;
  long lVar3;
  ulong uVar4;
  
  puVar1 = (ulong *)(pInLimit + -7);
  puVar2 = (ulong *)pIn;
  if (pIn < puVar1) {
    if (*(ulong *)pMatch != *(ulong *)pIn) {
      uVar4 = *(ulong *)pIn ^ *(ulong *)pMatch;
      return (uint)(byte)(((uVar4 - 1 ^ uVar4) & 0x101010101010100) * 0x101010101010101 >> 0x38);
    }
    pMatch = pMatch + 8;
    puVar2 = (ulong *)(pIn + 8);
  }
  if (puVar2 < puVar1) {
    lVar3 = (long)puVar2 - (long)pIn;
    do {
      if (*(ulong *)pMatch != *puVar2) {
        uVar4 = *puVar2 ^ *(ulong *)pMatch;
        return (uint)(byte)(((uVar4 - 1 ^ uVar4) & 0x101010101010100) * 0x101010101010101 >> 0x38) +
               (int)lVar3;
      }
      puVar2 = puVar2 + 1;
      pMatch = (BYTE *)((long)pMatch + 8);
      lVar3 = lVar3 + 8;
    } while (puVar2 < puVar1);
  }
  if ((puVar2 < pInLimit + -3) && ((int)*(ulong *)pMatch == (int)*puVar2)) {
    puVar2 = (ulong *)((long)puVar2 + 4);
    pMatch = (BYTE *)((long)pMatch + 4);
  }
  if ((puVar2 < pInLimit + -1) && ((short)*(ulong *)pMatch == (short)*puVar2)) {
    puVar2 = (ulong *)((long)puVar2 + 2);
    pMatch = (BYTE *)((long)pMatch + 2);
  }
  if (puVar2 < pInLimit) {
    puVar2 = (ulong *)((long)puVar2 + (ulong)((char)*(ulong *)pMatch == (char)*puVar2));
  }
  return (int)puVar2 - (int)pIn;
}

Assistant:

LZ4_FORCE_INLINE
unsigned LZ4_count(const BYTE* pIn, const BYTE* pMatch, const BYTE* pInLimit)
{
    const BYTE* const pStart = pIn;

    if (likely(pIn < pInLimit-(STEPSIZE-1))) {
        reg_t const diff = LZ4_read_ARCH(pMatch) ^ LZ4_read_ARCH(pIn);
        if (!diff) {
            pIn+=STEPSIZE; pMatch+=STEPSIZE;
        } else {
            return LZ4_NbCommonBytes(diff);
    }   }

    while (likely(pIn < pInLimit-(STEPSIZE-1))) {
        reg_t const diff = LZ4_read_ARCH(pMatch) ^ LZ4_read_ARCH(pIn);
        if (!diff) { pIn+=STEPSIZE; pMatch+=STEPSIZE; continue; }
        pIn += LZ4_NbCommonBytes(diff);
        return (unsigned)(pIn - pStart);
    }

    if ((STEPSIZE==8) && (pIn<(pInLimit-3)) && (LZ4_read32(pMatch) == LZ4_read32(pIn))) { pIn+=4; pMatch+=4; }
    if ((pIn<(pInLimit-1)) && (LZ4_read16(pMatch) == LZ4_read16(pIn))) { pIn+=2; pMatch+=2; }
    if ((pIn<pInLimit) && (*pMatch == *pIn)) pIn++;
    return (unsigned)(pIn - pStart);
}